

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Struct2Local::visitRefCast(Struct2Local *this,RefCast *curr)

{
  ParentChildInteraction PVar1;
  bool bVar2;
  Drop *left;
  Expression *right;
  Block *expression;
  optional<wasm::Type> type;
  optional<wasm::Type> local_38;
  uintptr_t local_28;
  uintptr_t local_20;
  RefCast *local_18;
  RefCast *curr_local;
  Struct2Local *this_local;
  
  local_18 = curr;
  curr_local = (RefCast *)this;
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    local_20 = (this->allocation->super_SpecificExpression<(wasm::Expression::Id)65>).
               super_Expression.type.id;
    local_28 = (local_18->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.
               id;
    bVar2 = wasm::Type::isSubType((Type)local_20,(Type)local_28);
    if (bVar2) {
      replaceCurrent(this,local_18->ref);
    }
    else {
      left = Builder::makeDrop(&this->builder,local_18->ref);
      right = (Expression *)Builder::makeUnreachable(&this->builder);
      std::optional<wasm::Type>::optional(&local_38);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_38.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_38.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      expression = Builder::makeSequence(&this->builder,(Expression *)left,right,type);
      replaceCurrent(this,(Expression *)expression);
    }
    this->refinalize = true;
  }
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    // We know this RefCast receives our allocation, so we can see whether it
    // succeeds or fails.
    if (Type::isSubType(allocation->type, curr->type)) {
      // The cast succeeds, so it is a no-op, and we can skip it, since after we
      // remove the allocation it will not even be needed for validation.
      replaceCurrent(curr->ref);
    } else {
      // The cast fails, so this must trap.
      replaceCurrent(builder.makeSequence(builder.makeDrop(curr->ref),
                                          builder.makeUnreachable()));
    }

    // Either way, we need to refinalize here (we either added an unreachable,
    // or we replaced a cast with the value being cast, which may have a less-
    // refined type - it will not be used after we remove the allocation, but we
    // must still fix that up for validation).
    refinalize = true;
  }